

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

void fctcl__del(fctcl_t *clo)

{
  if (clo != (fctcl_t *)0x0) {
    free(clo->long_opt);
    free(clo->short_opt);
    free(clo->value);
    free(clo->help);
    free(clo);
    return;
  }
  return;
}

Assistant:

static void
fctcl__del(fctcl_t *clo)
{
    if ( clo == NULL )
    {
        return;
    }
    free(clo->long_opt);
    free(clo->short_opt);
    free(clo->value);
    free(clo->help);
    free(clo);
}